

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

timediff_t ftp_timeleft_accept(Curl_easy *data)

{
  uint uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  timediff_t tVar4;
  timediff_t tVar5;
  ulong uVar6;
  curltime cVar7;
  curltime older;
  curltime local_20;
  
  uVar1 = (data->set).accepttimeout;
  uVar6 = 60000;
  if (uVar1 != 0) {
    uVar6 = (ulong)uVar1;
  }
  cVar7 = Curl_now();
  local_20.tv_sec = cVar7.tv_sec;
  local_20.tv_usec = cVar7.tv_usec;
  tVar4 = Curl_timeleft(data,&local_20,false);
  if ((tVar4 == 0) || ((long)uVar6 <= tVar4)) {
    cVar7.tv_usec = local_20.tv_usec;
    cVar7.tv_sec = local_20.tv_sec;
    uVar2 = (data->progress).t_acceptdata.tv_sec;
    uVar3 = (data->progress).t_acceptdata.tv_usec;
    older.tv_usec = uVar3;
    older.tv_sec = uVar2;
    cVar7._12_4_ = 0;
    older._12_4_ = 0;
    tVar5 = Curl_timediff(cVar7,older);
    tVar4 = -1;
    if (uVar6 - tVar5 != 0) {
      tVar4 = uVar6 - tVar5;
    }
  }
  return tVar4;
}

Assistant:

static timediff_t ftp_timeleft_accept(struct Curl_easy *data)
{
  timediff_t timeout_ms = DEFAULT_ACCEPT_TIMEOUT;
  timediff_t other;
  struct curltime now;

  if(data->set.accepttimeout > 0)
    timeout_ms = data->set.accepttimeout;

  now = Curl_now();

  /* check if the generic timeout possibly is set shorter */
  other = Curl_timeleft(data, &now, FALSE);
  if(other && (other < timeout_ms))
    /* note that this also works fine for when other happens to be negative
       due to it already having elapsed */
    timeout_ms = other;
  else {
    /* subtract elapsed time */
    timeout_ms -= Curl_timediff(now, data->progress.t_acceptdata);
    if(!timeout_ms)
      /* avoid returning 0 as that means no timeout! */
      return -1;
  }

  return timeout_ms;
}